

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O0

Bool prvTidynodeIsHeader(Node *node)

{
  bool local_1a;
  bool local_19;
  TidyTagId local_18;
  TidyTagId tid;
  Node *node_local;
  
  if ((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) {
    local_18 = TidyTag_UNKNOWN;
  }
  else {
    local_18 = node->tag->id;
  }
  local_19 = false;
  if (local_18 != TidyTag_UNKNOWN) {
    local_1a = true;
    if ((((local_18 != TidyTag_H1) && (local_1a = true, local_18 != TidyTag_H2)) &&
        (local_1a = true, local_18 != TidyTag_H3)) &&
       ((local_1a = true, local_18 != TidyTag_H4 && (local_1a = true, local_18 != TidyTag_H5)))) {
      local_1a = local_18 == TidyTag_H6;
    }
    local_19 = local_1a;
  }
  return (Bool)local_19;
}

Assistant:

Bool TY_(nodeIsHeader)( Node* node )
{
    TidyTagId tid = TagId( node  );
    return ( tid && (
             tid == TidyTag_H1 ||
             tid == TidyTag_H2 ||
             tid == TidyTag_H3 ||
             tid == TidyTag_H4 ||
             tid == TidyTag_H5 ||
             tid == TidyTag_H6 ));
}